

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O1

void __thiscall PCA::fit(PCA *this,Matrix *X)

{
  Index IVar1;
  ulong rows;
  double *pdVar2;
  undefined1 auVar3 [16];
  Index size;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double __x;
  undefined1 auVar9 [16];
  double dVar10;
  Vector mu;
  Matrix res;
  assign_op<double,_double> local_a1;
  double *local_a0;
  ulong local_98;
  void *local_90;
  DenseStorage<double,__1,__1,__1,_1> local_88;
  PCA *local_70;
  double local_68;
  double local_60;
  Matrix<double,__1,__1,_0,__1,__1> local_58;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_40;
  
  IVar1 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)X;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a0,
             (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
              *)&local_58);
  if ((long)local_98 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar5 = (uint)IVar1;
  dVar8 = (double)(int)uVar5;
  uVar6 = local_98 - ((long)local_98 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)local_98) {
    lVar7 = 0;
    do {
      auVar9._8_8_ = dVar8;
      auVar9._0_8_ = dVar8;
      auVar9 = divpd(*(undefined1 (*) [16])(local_a0 + lVar7),auVar9);
      *(undefined1 (*) [16])(local_a0 + lVar7) = auVar9;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < (long)local_98) {
    do {
      local_a0[uVar6] = local_a0[uVar6] / dVar8;
      uVar6 = uVar6 + 1;
    } while (local_98 != uVar6);
  }
  uVar6 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  if ((long)uVar6 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar6 == 0) {
    local_90 = (void *)0x0;
LAB_00107402:
    rows = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
    local_88.m_data = (double *)0x0;
    local_88.m_rows = 0;
    local_88.m_cols = 0;
    if ((long)(rows | uVar6) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    local_70 = this;
    if ((rows != 0 && uVar6 != 0) &&
       (auVar3._8_8_ = 0, auVar3._0_8_ = uVar6,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar3,0) < (long)rows)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::ios::widen;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_88,rows * uVar6,rows,uVar6);
    if (0 < (int)uVar5) {
      __x = (double)(int)(uVar5 - 1);
      uVar6 = 0;
      local_68 = SQRT(__x);
      dVar8 = local_68;
      local_60 = __x;
      do {
        pdVar2 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                 m_data;
        lVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_cols;
        if (lVar7 < 0 && pdVar2 != (double *)0x0) {
LAB_001075e3:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb0,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                       );
        }
        if ((X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
            <= (long)uVar6) {
LAB_001075c4:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                       );
        }
        if ((lVar7 != 1) || (local_98 != 1)) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        dVar10 = dVar8;
        if (__x < 0.0) {
          dVar8 = sqrt(__x);
          dVar10 = local_68;
          __x = local_60;
        }
        if (local_88.m_cols < 0 && local_88.m_data != (double *)0x0) goto LAB_001075e3;
        if (local_88.m_rows <= (long)uVar6) goto LAB_001075c4;
        if (local_88.m_cols != 1) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>]"
                       );
        }
        local_88.m_data[uVar6] = (pdVar2[uVar6] - *local_a0) / dVar8;
        uVar6 = uVar6 + 1;
        dVar8 = dVar10;
      } while ((uVar5 & 0x7fffffff) != uVar6);
    }
    local_40.m_lhs.m_matrix = (non_const_type)&local_88;
    local_40.m_rhs = (RhsNested)&local_88;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_58,&local_40);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              (&local_70->covarianza,&local_58,&local_a1);
    free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_88.m_data);
    free(local_90);
    free(local_a0);
    return;
  }
  if (uVar6 >> 0x3d == 0) {
    local_90 = malloc(uVar6 * 8);
    if (uVar6 != 1 && ((ulong)local_90 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb8,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (local_90 != (void *)0x0) goto LAB_00107402;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::ios::widen;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void PCA::fit(Matrix X)
{
	int n = X.rows();

	Vector mu = X.rowwise().sum();
	mu = mu / n;

	Vector iesima(X.cols());

	Matrix res(X.rows(), X.cols());

	for(int i = 0; i < n; i++)
		res.row(i) = (X.row(i) - mu) / sqrt(n - 1);

	covarianza = (res.transpose())*res;
}